

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O2

string_view __thiscall bloaty::dwarf::ReadDebugStrEntry(dwarf *this,string_view section,size_t ofs)

{
  string_view sVar1;
  string_view local_18;
  
  local_18._M_str = (char *)section._M_len;
  local_18._M_len = (size_t)this;
  ReadBytes((size_t)section._M_str,&local_18);
  sVar1 = ReadNullTerminated(&local_18);
  return sVar1;
}

Assistant:

std::string_view ReadDebugStrEntry(std::string_view section, size_t ofs) {
  SkipBytes(ofs, &section);
  return ReadNullTerminated(&section);
}